

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O1

LIndex IndexTools::IndividualToJointIndicesArray
                 (LIndex *indices,
                 vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  pointer puVar1;
  pointer puVar2;
  LIndex *pLVar3;
  ulong uVar4;
  LIndex LVar5;
  
  puVar1 = (nrElems->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (nrElems->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pLVar3 = CalculateStepSize(nrElems);
  if (puVar1 == puVar2) {
    LVar5 = 0;
  }
  else {
    uVar4 = 0;
    LVar5 = 0;
    do {
      LVar5 = LVar5 + pLVar3[uVar4] * indices[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < (ulong)((long)puVar1 - (long)puVar2 >> 3));
  }
  operator_delete__(pLVar3);
  return LVar5;
}

Assistant:

LIndex IndexTools::IndividualToJointIndicesArray(LIndex* indices,
        const vector<LIndex>& nrElems) 
{
    size_t vec_size = nrElems.size();
    LIndex* step_size=CalculateStepSize(nrElems);

    LIndex jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];

    delete [] step_size;

    return(jointI);
}